

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

bool __thiscall UniValue::setInt(UniValue *this,int64_t val_)

{
  bool bVar1;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream oss;
  int64_t val__local;
  UniValue *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<((ostream *)local_190,val_);
  std::__cxx11::ostringstream::str();
  bVar1 = setNumStr(this,local_1c0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return bVar1;
}

Assistant:

bool UniValue::setInt(int64_t val_)
{
    std::ostringstream oss;

    oss << val_;

    return setNumStr(oss.str());
}